

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::onAllProcessed(SaturationAlgorithm *this)

{
  long lVar1;
  SymElOutput *in_RDI;
  Splitter *in_stack_00000030;
  
  lVar1._0_4_ = in_RDI[2]._symElRewrites._timestamp;
  lVar1._4_4_ = in_RDI[2]._symElRewrites._size;
  if (lVar1 != 0) {
    SymElOutput::onAllProcessed(in_RDI);
  }
  if (in_RDI[1]._printer._tgtStream != (ostream *)0x0) {
    Splitter::onAllProcessed(in_stack_00000030);
  }
  if (*(long *)&in_RDI[1]._printer._headersPrinted != 0) {
    ConsequenceFinder::onAllProcessed((ConsequenceFinder *)this);
  }
  return;
}

Assistant:

void SaturationAlgorithm::onAllProcessed()
{
  ASS(clausesFlushed());

  if (_symEl) {
    _symEl->onAllProcessed();
  }

  if (_splitter) {
    _splitter->onAllProcessed();
  }

  if (_consFinder) {
    _consFinder->onAllProcessed();
  }
}